

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CECoordinates.cpp
# Opt level: O3

void CECoordinates::ICRS2Galactic
               (double input_ra,double input_dec,double *glon,double *glat,CEAngleType *angle_type)

{
  if (*angle_type == DEGREES) {
    input_ra = input_ra * 0.017453292519943295;
    input_dec = input_dec * 0.017453292519943295;
  }
  iauIcrs2g(input_ra,input_dec,glon,glat);
  if (*angle_type == DEGREES) {
    *glon = *glon * 57.29577951308232;
    *glat = *glat * 57.29577951308232;
  }
  return;
}

Assistant:

void CECoordinates::ICRS2Galactic(double input_ra, double input_dec, 
                                  double *glon, double *glat,
                                  const CEAngleType& angle_type)
{
    // Convert to radians if necessary
    if (angle_type == CEAngleType::DEGREES) {
        input_ra *= DD2R ;
        input_dec *= DD2R ;
    }
    
    // Use the sofa method to convert the coordinates
    iauIcrs2g(input_ra, input_dec, glon, glat) ;
    
    // Convert back to degrees if necessary
    if (angle_type == CEAngleType::DEGREES) {
        *glon *= DR2D ;
        *glat *= DR2D ;
    }
}